

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

uint16_t float_to_half_int(uint32_t fiv)

{
  uint16_t uVar1;
  anon_union_4_2_947300a4 v;
  
  uVar1 = float_to_half(0.0);
  return uVar1;
}

Assistant:

static inline uint16_t
float_to_half_int (uint32_t fiv)
{
    union
    {
        uint32_t i;
        float    f;
    } v;
    v.i = fiv;
    return float_to_half (v.f);
}